

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O2

void __thiscall
anurbs::NurbsCurveGeometry<2L>::NurbsCurveGeometry
          (NurbsCurveGeometry<2L> *this,Index degree,Index nb_poles,bool is_rational)

{
  long local_40;
  Index local_38;
  
  (this->super_CurveBase<2L>)._vptr_CurveBase = (_func_int **)&PTR__NurbsCurveGeometry_0038c610;
  this->m_degree = degree;
  local_40 = degree + -1 + nb_poles;
  local_38 = nb_poles;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_knots,&local_40);
  local_40 = 2;
  Eigen::Matrix<double,-1,2,1,-1,2>::Matrix<long,long>
            ((Matrix<double,_1,2,1,_1,2> *)&this->m_poles,&local_38,&local_40);
  local_40 = local_38;
  if (!is_rational) {
    local_40 = 0;
  }
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&this->m_weights,&local_40);
  return;
}

Assistant:

NurbsCurveGeometry(
        const Index degree,
        Index nb_poles,
        bool is_rational)
    : m_degree(degree)
    , m_poles(nb_poles, TDimension)
    , m_weights(is_rational ? nb_poles : 0)
    , m_knots(Nurbs::nb_knots(degree, nb_poles))
    {
        static_assert(TDimension > 0);
    }